

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::SubRoutineLocCompilationNonNumberLiteral::Run
          (SubRoutineLocCompilationNonNumberLiteral *this)

{
  long lVar1;
  string def;
  string local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "\nsubroutine vec4 st0(float param);\nsubroutine(st0) vec4 sf0(float param) { return param; }\nlayout(location = x ) subroutine uniform st0 u0;"
             ,"");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_38 + (long)local_40);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeCompile
                    (&this->super_ExplicitUniformLocationCaseBase,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return lVar1;
}

Assistant:

virtual long Run()
	{

		std::string def =
			NL "subroutine vec4 st0(float param);" NL "subroutine(st0) vec4 sf0(float param) { return param; }" NL
			   "layout(location = x ) subroutine uniform st0 u0;";

		return doRunNegativeCompile(def);
	}